

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O1

HRESULT utf8::NarrowStringToWide<void*(*)(unsigned_long)>
                  (_func_void_ptr_unsigned_long *allocator,LPCSTR sourceString,size_t sourceCount,
                  LPWSTR *destStringPtr,charcount_t *destCount,size_t *allocateCount)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  LPWSTR pWVar5;
  undefined4 *puVar6;
  HRESULT HVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar8 = sourceCount * 2 + 2;
  HVar7 = -0x7ff8fff2;
  if (sourceCount <= uVar8) {
    pWVar5 = (LPWSTR)(*allocator)(uVar8);
    if (pWVar5 == (LPWSTR)0x0) {
      HVar7 = -0x7ff8fff2;
    }
    else {
      if (allocateCount != (size_t *)0x0) {
        *allocateCount = uVar8;
      }
      *destStringPtr = pWVar5;
      HVar7 = -0x7ff8fff2;
      if (sourceCount < 0xffffffff) {
        uVar8 = 0;
        if (sourceCount != 0) {
          do {
            cVar1 = sourceString[uVar8];
            if (cVar1 < '\x01') {
              bVar3 = uVar8 < 3;
              uVar8 = uVar8 - 3;
              if (bVar3) {
                uVar8 = 0;
              }
            }
            else {
              pWVar5[uVar8] = (short)cVar1;
            }
          } while (('\0' < cVar1) && (uVar8 = uVar8 + 1, uVar8 < sourceCount));
        }
        if (sourceCount - uVar8 == 0) {
          *destCount = (charcount_t)sourceCount;
          pWVar5[sourceCount] = L'\0';
        }
        else {
          cVar4 = ByteIndexIntoCharacterIndex
                            ((LPCUTF8)(sourceString + uVar8),sourceCount - uVar8,doDefault);
          uVar9 = (int)uVar8 + cVar4;
          if (sourceCount < uVar9) {
            return -0x7ff8fff2;
          }
          DecodeUnitsIntoAndNullTerminateNoAdvance
                    (pWVar5 + uVar8,(LPCUTF8)(sourceString + uVar8),
                     (LPCUTF8)(sourceString + sourceCount),doAllowInvalidWCHARs,(bool *)0x0);
          *destCount = uVar9;
        }
        HVar7 = 0;
        if (pWVar5[*destCount] != L'\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                             ,0xaa,"(destString[*destCount] == 0)","destString[*destCount] == 0");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
          HVar7 = 0;
        }
      }
      else {
        *pWVar5 = L'\0';
      }
    }
  }
  return HVar7;
}

Assistant:

HRESULT NarrowStringToWide(_In_ AllocatorFunction allocator,_In_ LPCSTR sourceString,
        size_t sourceCount, _Out_ LPWSTR* destStringPtr, _Out_ charcount_t* destCount, size_t* allocateCount = nullptr)
    {
        size_t cbDestString = (sourceCount + 1) * sizeof(WCHAR);
        if (cbDestString < sourceCount) // overflow ?
        {
            return E_OUTOFMEMORY;
        }

        WCHAR* destString = (WCHAR*)allocator(cbDestString);
        if (destString == nullptr)
        {
            return E_OUTOFMEMORY;
        }

        if (allocateCount != nullptr)
        {
            *allocateCount = cbDestString;
        }

        *destStringPtr = destString;
        return NarrowStringToWideNoAlloc(sourceString, sourceCount, destString, sourceCount + 1, destCount);
    }